

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O2

void __thiscall
tchecker::details::expression_typechecker_t::normalize_clock_comparison
          (expression_typechecker_t *this,binary_operator_t *op,
          shared_ptr<tchecker::typed_expression_t> *left,
          shared_ptr<tchecker::typed_expression_t> *right,binary_expression_t *expr)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  binary_operator_t bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_138;
  expression_type_t new_left_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  bVar3 = predicate(*op);
  if (bVar3) {
    bVar3 = clock_involved(((right->
                            super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->_type);
    if (bVar3) {
      bVar3 = clock_involved(((left->
                              super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr)->_type);
      if (bVar3) {
        new_left_type =
             type_binary(EXPR_OP_MINUS,
                         ((left->
                          super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->_type,
                         ((right->
                          super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->_type);
        local_110._M_dataplus._M_p._0_4_ = 7;
        std::
        make_shared<tchecker::typed_binary_expression_t,tchecker::expression_type_t&,tchecker::binary_operator_t,std::shared_ptr<tchecker::typed_expression_t>&,std::shared_ptr<tchecker::typed_expression_t>&>
                  ((expression_type_t *)&bStack_138,&new_left_type,
                   (shared_ptr<tchecker::typed_expression_t> *)&local_110,left);
        std::__shared_ptr<tchecker::typed_expression_t,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<tchecker::typed_expression_t,(__gnu_cxx::_Lock_policy)2> *)left,
                   (__shared_ptr<tchecker::typed_binary_expression_t,_(__gnu_cxx::_Lock_policy)2> *)
                   &bStack_138);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_138._M_string_length);
        local_110._M_dataplus._M_p._0_4_ = 1;
        local_f0._M_dataplus._M_p._0_4_ = 0;
        std::make_shared<tchecker::typed_int_expression_t,tchecker::expression_type_t,int>
                  ((expression_type_t *)&bStack_138,(int *)&local_110);
        std::__shared_ptr<tchecker::typed_expression_t,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<tchecker::typed_expression_t,(__gnu_cxx::_Lock_policy)2> *)right,
                   (__shared_ptr<tchecker::typed_int_expression_t,_(__gnu_cxx::_Lock_policy)2> *)
                   &bStack_138);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_138._M_string_length);
        if (((left->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->_type == EXPR_TYPE_BAD) {
          expression_t::to_string_abi_cxx11_
                    (&local_50,(expression_t *)(&expr->field_0x0 + *(long *)(*(long *)expr + -0x38))
                    );
          std::operator+(&local_90,"in expression ",&local_50);
          std::operator+(&local_70,&local_90,", invalid comparison of clock expressions ");
          expression_t::to_string_abi_cxx11_
                    (&local_b0,
                     (expr->_left).
                     super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::operator+(&local_f0,&local_70,&local_b0);
          std::operator+(&local_110,&local_f0," and ");
          expression_t::to_string_abi_cxx11_
                    (&local_d0,
                     (expr->_right).
                     super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::operator+(&bStack_138,&local_110,&local_d0);
          std::
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::operator()(&this->_error,&bStack_138);
          std::__cxx11::string::~string((string *)&bStack_138);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      else {
        peVar1 = (left->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        (left->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             = (right->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
        (right->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             = peVar1;
        p_Var2 = (right->
                 super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        (right->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi =
             (left->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        (left->super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = p_Var2;
        bVar4 = reverse_cmp(*op);
        *op = bVar4;
      }
    }
  }
  return;
}

Assistant:

void normalize_clock_comparison(enum tchecker::binary_operator_t & op, std::shared_ptr<tchecker::typed_expression_t> & left,
                                  std::shared_ptr<tchecker::typed_expression_t> & right,
                                  tchecker::binary_expression_t const & expr)
  {
    // do not do anything if `op` is not a comparator or if not clock is involved on the right-hand side
    if (!tchecker::predicate(op) || !tchecker::clock_involved(right->type()))
      return;

    // `op` is a comparator and clocks appear on `right` but not on `left`: swap left/right and reverse op
    if (!tchecker::clock_involved(left->type())) {
      std::swap(left, right);
      op = tchecker::reverse_cmp(op);
    }
    // `op` is a comparator and clocks appear both on `left` and `right`: rewrite as left-right op 0
    else {
      enum tchecker::expression_type_t new_left_type = type_binary(tchecker::EXPR_OP_MINUS, left->type(), right->type());
      left = std::make_shared<tchecker::typed_binary_expression_t>(new_left_type, tchecker::EXPR_OP_MINUS, left, right);
      right = std::make_shared<tchecker::typed_int_expression_t>(tchecker::EXPR_TYPE_INTTERM, 0);
      if (left->type() == tchecker::EXPR_TYPE_BAD)
        _error("in expression " + expr.to_string() + ", invalid comparison of clock expressions " +
               expr.left_operand().to_string() + " and " + expr.right_operand().to_string());
    }
  }